

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O1

int llvm::
    array_pod_sort_comparator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>
              (void *P1,void *P2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(uint *)((long)P2 + 4) <= *(uint *)((long)P1 + 4)) {
    uVar1 = (uint)(*(uint *)((long)P2 + 4) < *(uint *)((long)P1 + 4));
  }
  return uVar1;
}

Assistant:

inline int array_pod_sort_comparator(const void *P1, const void *P2) {
  if (std::less<T>()(*reinterpret_cast<const T*>(P1),
                     *reinterpret_cast<const T*>(P2)))
    return -1;
  if (std::less<T>()(*reinterpret_cast<const T*>(P2),
                     *reinterpret_cast<const T*>(P1)))
    return 1;
  return 0;
}